

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void disas_bfext_mem(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx;
  TCGv_i32 lo;
  uint32_t uVar1;
  uintptr_t o_1;
  TCGv_i32 pTVar2;
  TCGv_i32 pTVar3;
  TCGv_i32 pTVar4;
  TCGTemp *ret;
  uintptr_t o_6;
  uintptr_t o_5;
  uintptr_t o;
  TCGTemp *local_58;
  TCGv_i32 local_50;
  TCGv_i32 local_48;
  TCGv_i32 local_40;
  
  tcg_ctx = s->uc->tcg_ctx;
  uVar1 = cpu_lduw_code_m68k(env,s->pc);
  s->pc = s->pc + 2;
  lo = *(TCGv_i32 *)((long)tcg_ctx->cpu_dregs + (ulong)(uVar1 >> 9 & 0x38));
  pTVar2 = gen_lea_mode(env,s,insn >> 3 & 7,insn & 7,7);
  if (pTVar2 != tcg_ctx->NULL_QREG) {
    if ((uVar1 & 0x20) == 0) {
      pTVar3 = tcg_const_i32_m68k(tcg_ctx,uVar1 & 0x1f);
    }
    else {
      pTVar3 = tcg_ctx->cpu_dregs[uVar1 & 7];
    }
    if ((uVar1 >> 0xb & 1) == 0) {
      pTVar4 = tcg_const_i32_m68k(tcg_ctx,uVar1 >> 6 & 0x1f);
    }
    else {
      pTVar4 = tcg_ctx->cpu_dregs[uVar1 >> 6 & 7];
    }
    if ((insn >> 9 & 1) == 0) {
      ret = tcg_temp_new_internal_m68k(tcg_ctx,TCG_TYPE_I64,false);
      local_58 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      local_50 = pTVar2 + (long)tcg_ctx;
      local_48 = pTVar4 + (long)tcg_ctx;
      local_40 = pTVar3 + (long)tcg_ctx;
      tcg_gen_callN_m68k(tcg_ctx,helper_bfextu_mem_m68k,ret,4,&local_58);
      tcg_gen_extr_i64_i32_m68k(tcg_ctx,lo,QREG_CC_N,(TCGv_i64)((long)ret - (long)tcg_ctx));
      tcg_temp_free_internal_m68k(tcg_ctx,ret);
    }
    else {
      local_58 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      local_50 = pTVar2 + (long)tcg_ctx;
      local_48 = pTVar4 + (long)tcg_ctx;
      local_40 = pTVar3 + (long)&tcg_ctx->pool_cur;
      tcg_gen_callN_m68k(tcg_ctx,helper_bfexts_mem_m68k,(TCGTemp *)(lo + (long)&tcg_ctx->pool_cur),4
                         ,&local_58);
      if (QREG_CC_N != lo) {
        tcg_gen_op2_m68k(tcg_ctx,INDEX_op_mov_i32,(TCGArg)(QREG_CC_N + (long)tcg_ctx),
                         (TCGArg)(lo + (long)&tcg_ctx->pool_cur));
      }
    }
    set_cc_op(s,CC_OP_LOGIC);
    if ((uVar1 & 0x20) == 0) {
      tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(pTVar3 + (long)tcg_ctx));
    }
    if ((uVar1 >> 0xb & 1) == 0) {
      tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(pTVar4 + (long)tcg_ctx));
    }
    return;
  }
  gen_exception(s,(s->base).pc_next,3);
  return;
}

Assistant:

DISAS_INSN(bfext_mem)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int ext = read_im16(env, s);
    int is_sign = insn & 0x200;
    TCGv dest = DREG(ext, 12);
    TCGv addr, len, ofs;

    addr = gen_lea(env, s, insn, OS_UNSIZED);
    if (IS_NULL_QREG(addr)) {
        gen_addr_fault(s);
        return;
    }

    if (ext & 0x20) {
        len = DREG(ext, 0);
    } else {
        len = tcg_const_i32(tcg_ctx, extract32(ext, 0, 5));
    }
    if (ext & 0x800) {
        ofs = DREG(ext, 6);
    } else {
        ofs = tcg_const_i32(tcg_ctx, extract32(ext, 6, 5));
    }

    if (is_sign) {
        gen_helper_bfexts_mem(tcg_ctx, dest, tcg_ctx->cpu_env, addr, ofs, len);
        tcg_gen_mov_i32(tcg_ctx, QREG_CC_N, dest);
    } else {
        TCGv_i64 tmp = tcg_temp_new_i64(tcg_ctx);
        gen_helper_bfextu_mem(tcg_ctx, tmp, tcg_ctx->cpu_env, addr, ofs, len);
        tcg_gen_extr_i64_i32(tcg_ctx, dest, QREG_CC_N, tmp);
        tcg_temp_free_i64(tcg_ctx, tmp);
    }
    set_cc_op(s, CC_OP_LOGIC);

    if (!(ext & 0x20)) {
        tcg_temp_free(tcg_ctx, len);
    }
    if (!(ext & 0x800)) {
        tcg_temp_free(tcg_ctx, ofs);
    }
}